

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolj.c
# Opt level: O2

int ffpssjj(fitsfile *fptr,long group,long naxis,long *naxes,long *fpixel,long *lpixel,
           LONGLONG *array,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long firstelem;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  LONGLONG *array_00;
  LONGLONG firstrow;
  bool bVar20;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long irange [7];
  LONGLONG fpix [7];
  LONGLONG dimen [7];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    iVar1 = fits_is_compressed_image(fptr,status);
    if (iVar1 == 0) {
      if (naxis - 8U < 0xfffffffffffffff9) {
        *status = 0x140;
        iVar1 = 0x140;
      }
      else {
        for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
          fpix[lVar2] = 1;
          irange[lVar2] = 1;
          dimen[lVar2] = 1;
        }
        for (lVar2 = 0; naxis != lVar2; lVar2 = lVar2 + 1) {
          lVar10 = fpixel[lVar2];
          fpix[lVar2] = lVar10;
          irange[lVar2] = (lpixel[lVar2] - lVar10) + 1;
          dimen[lVar2] = naxes[lVar2];
        }
        firstrow = 1;
        if (1 < group) {
          firstrow = group;
        }
        lVar10 = dimen[1] * dimen[0];
        lVar12 = dimen[2] * lVar10;
        lVar15 = dimen[3] * lVar12;
        lVar17 = dimen[4] * lVar15;
        local_1f0 = (fpix[6] + -1) * dimen[5] * lVar17;
        lVar14 = 0;
        lVar2 = irange[1];
        if (irange[1] < 1) {
          lVar2 = lVar14;
        }
        lVar13 = irange[2];
        if (irange[2] < 1) {
          lVar13 = lVar14;
        }
        lVar3 = irange[3];
        if (irange[3] < 1) {
          lVar3 = lVar14;
        }
        lVar4 = irange[4];
        if (irange[4] < 1) {
          lVar4 = lVar14;
        }
        lVar5 = irange[5];
        if (irange[5] < 1) {
          lVar5 = lVar14;
        }
        lVar6 = irange[6];
        if (irange[6] < 1) {
          lVar6 = lVar14;
        }
        for (lVar16 = 0; lVar16 != lVar6; lVar16 = lVar16 + 1) {
          local_1e8 = (fpix[5] + -1) * lVar17;
          for (lVar9 = 0; lVar9 != lVar5; lVar9 = lVar9 + 1) {
            local_1e0 = (fpix[4] + -1) * lVar15;
            for (lVar8 = 0; lVar8 != lVar4; lVar8 = lVar8 + 1) {
              local_1d8 = (fpix[3] + -1) * lVar12;
              for (lVar7 = 0; lVar7 != lVar3; lVar7 = lVar7 + 1) {
                lVar11 = (fpix[2] + -1) * lVar10;
                for (lVar18 = 0; lVar18 != lVar13; lVar18 = lVar18 + 1) {
                  firstelem = (fpix[1] + -1) * dimen[0] + fpix[0] + local_1f0 + local_1e8 +
                              local_1e0 + local_1d8 + lVar11;
                  array_00 = array + lVar14;
                  lVar19 = lVar2;
                  while (bVar20 = lVar19 != 0, lVar19 = lVar19 + -1, bVar20) {
                    iVar1 = ffpcljj(fptr,2,firstrow,firstelem,irange[0],array_00,status);
                    if (0 < iVar1) goto LAB_001d9ca5;
                    lVar14 = lVar14 + irange[0];
                    firstelem = firstelem + dimen[0];
                    array_00 = array_00 + irange[0];
                  }
                  lVar11 = lVar11 + lVar10;
                }
                local_1d8 = local_1d8 + lVar12;
              }
              local_1e0 = local_1e0 + lVar15;
            }
            local_1e8 = local_1e8 + lVar17;
          }
          local_1f0 = local_1f0 + dimen[5] * lVar17;
        }
LAB_001d9ca5:
        iVar1 = *status;
      }
    }
    else {
      ffpmsg("writing TLONGLONG to compressed image is not supported");
      *status = 0x19d;
      iVar1 = 0x19d;
    }
  }
  return iVar1;
}

Assistant:

int ffpssjj(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,      /* I - group to write(1 = 1st group)           */
           long  naxis,      /* I - number of data axes in array            */
           long  *naxes,     /* I - size of each FITS axis                  */
           long  *fpixel,    /* I - 1st pixel in each axis to write (1=1st) */
           long  *lpixel,    /* I - last pixel in each axis to write        */
           LONGLONG *array,  /* I - array to be written                     */
           int  *status)     /* IO - error status                           */
/*
  Write a subsection of pixels to the primary array or image.
  A subsection is defined to be any contiguous rectangular
  array of pixels within the n-dimensional FITS data file.
  Data conversion and scaling will be performed if necessary 
  (e.g, if the datatype of the FITS array is not the same as
  the array being written).
*/
{
    long tablerow;
    LONGLONG fpix[7], dimen[7], astart, pstart;
    LONGLONG off2, off3, off4, off5, off6, off7;
    LONGLONG st10, st20, st30, st40, st50, st60, st70;
    LONGLONG st1, st2, st3, st4, st5, st6, st7;
    long ii, i1, i2, i3, i4, i5, i6, i7, irange[7];

    if (*status > 0)
        return(*status);

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TLONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    if (naxis < 1 || naxis > 7)
      return(*status = BAD_DIMEN);

    tablerow=maxvalue(1,group);

     /* calculate the size and number of loops to perform in each dimension */
    for (ii = 0; ii < 7; ii++)
    {
      fpix[ii]=1;
      irange[ii]=1;
      dimen[ii]=1;
    }

    for (ii = 0; ii < naxis; ii++)
    {    
      fpix[ii]=fpixel[ii];
      irange[ii]=lpixel[ii]-fpixel[ii]+1;
      dimen[ii]=naxes[ii];
    }

    i1=irange[0];

    /* compute the pixel offset between each dimension */
    off2 =     dimen[0];
    off3 = off2 * dimen[1];
    off4 = off3 * dimen[2];
    off5 = off4 * dimen[3];
    off6 = off5 * dimen[4];
    off7 = off6 * dimen[5];

    st10 = fpix[0];
    st20 = (fpix[1] - 1) * off2;
    st30 = (fpix[2] - 1) * off3;
    st40 = (fpix[3] - 1) * off4;
    st50 = (fpix[4] - 1) * off5;
    st60 = (fpix[5] - 1) * off6;
    st70 = (fpix[6] - 1) * off7;

    /* store the initial offset in each dimension */
    st1 = st10;
    st2 = st20;
    st3 = st30;
    st4 = st40;
    st5 = st50;
    st6 = st60;
    st7 = st70;

    astart = 0;

    for (i7 = 0; i7 < irange[6]; i7++)
    {
     for (i6 = 0; i6 < irange[5]; i6++)
     {
      for (i5 = 0; i5 < irange[4]; i5++)
      {
       for (i4 = 0; i4 < irange[3]; i4++)
       {
        for (i3 = 0; i3 < irange[2]; i3++)
        {
         pstart = st1 + st2 + st3 + st4 + st5 + st6 + st7;

         for (i2 = 0; i2 < irange[1]; i2++)
         {
           if (ffpcljj(fptr, 2, tablerow, pstart, i1, &array[astart],
              status) > 0)
              return(*status);

           astart += i1;
           pstart += off2;
         }
         st2 = st20;
         st3 = st3+off3;    
        }
        st3 = st30;
        st4 = st4+off4;
       }
       st4 = st40;
       st5 = st5+off5;
      }
      st5 = st50;
      st6 = st6+off6;
     }
     st6 = st60;
     st7 = st7+off7;
    }
    return(*status);
}